

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void output_c_for_amode_ptr(Token *t,BOOL reversed)

{
  uint uVar1;
  char *pcVar2;
  uint local_26c;
  uint local_25c;
  uint local_24c;
  char local_228 [4];
  int size;
  char buf [512];
  int mode;
  int reg;
  BOOL reversed_local;
  Token *t_local;
  
  uVar1 = (t->u).reginfo.which & 7;
  local_26c = (uint)(t->u).reginfo.size;
  switch((t->u).reginfo.which >> 3 & 7) {
  case 0:
  case 1:
    fatal_error("Internal error: called output_c_for_amode_ptr with a register addressing mode!");
    break;
  case 2:
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d)) ",(ulong)uVar1);
    break;
  case 3:
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d)) ",(ulong)uVar1);
    if ((local_26c == 1) && (uVar1 != 7)) {
      sprintf(local_228,"++ADDRESS_REGISTER_UL (%d); ",(ulong)uVar1);
    }
    else {
      local_24c = local_26c;
      if ((uVar1 == 7) && (local_26c == 1)) {
        local_24c = 2;
      }
      sprintf(local_228,"INC_VAR (ADDRESS_REGISTER_UL (%d), %d); ",(ulong)uVar1,(ulong)local_24c);
    }
    pcVar2 = strstr(c_postamble,local_228);
    if (pcVar2 == (char *)0x0) {
      strcat(c_postamble,local_228);
    }
    break;
  case 4:
    local_25c = local_26c;
    if ((uVar1 == 7) && (local_26c == 1)) {
      local_25c = 2;
    }
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d) - %d) ",(ulong)uVar1,(ulong)local_25c
           );
    if ((local_26c == 1) && (uVar1 != 7)) {
      sprintf(local_228,"--ADDRESS_REGISTER_UL (%d); ",(ulong)uVar1);
    }
    else {
      if ((uVar1 == 7) && (local_26c == 1)) {
        local_26c = 2;
      }
      sprintf(local_228,"DEC_VAR (ADDRESS_REGISTER_UL (%d), %d); ",(ulong)uVar1,(ulong)local_26c);
    }
    pcVar2 = strstr(c_postamble,local_228);
    if (pcVar2 == (char *)0x0) {
      strcat(c_postamble,local_228);
    }
    break;
  case 5:
    fatal_error(
               "Internal error: attempting to generate code for fixed amode 5.  It should have been expanded and replaced with explicit code to compute the pointer.\n"
               );
    break;
  case 6:
  case 7:
    if (reversed == FALSE) {
      fprintf((FILE *)syn68k_c_stream," (cpu_state.amode_p) ");
    }
    else {
      fprintf((FILE *)syn68k_c_stream," (cpu_state.reversed_amode_p) ");
    }
  }
  return;
}

Assistant:

static void
output_c_for_amode_ptr (const Token *t, BOOL reversed)
{
  int reg = t->u.amodeinfo.which & 7, mode = (t->u.amodeinfo.which >> 3) & 7;
  char buf[512];
  int size = t->u.amodeinfo.size;

  switch (mode) {
  case 0:
  case 1:
    fatal_error ("Internal error: called output_c_for_amode_ptr with "
		 "a register addressing mode!");
    break;

  case 2:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d)) ", reg);
    break;

  case 3:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d)) ", reg);

    /* Perform postincrement, but force sp to remain even! */
    if (size == 1 && reg != 7)
      sprintf (buf, "++ADDRESS_REGISTER_UL (%d); ", reg);
    else
      sprintf (buf, "INC_VAR (ADDRESS_REGISTER_UL (%d), %d); ", reg,
	       (reg != 7 || size != 1) ? size : 2);
    if (strstr (c_postamble, buf) == NULL)
      strcat (c_postamble, buf);
    break;
  case 4:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d) - %d) ", reg,
	     (reg != 7 || size != 1) ? size : 2);

    /* Perform predecrement, but force sp to remain even! */
    if (size == 1 && reg != 7)
      sprintf (buf, "--ADDRESS_REGISTER_UL (%d); ", reg);
    else
      sprintf (buf, "DEC_VAR (ADDRESS_REGISTER_UL (%d), %d); ", reg,
	       (reg != 7 || size != 1) ? size : 2);
    if (strstr (c_postamble, buf) == NULL)
      strcat (c_postamble, buf);
    break;
  case 5:
    fatal_error ("Internal error: attempting to generate code for fixed "
		 "amode 5.  It should have been expanded and replaced with "
		 "explicit code to compute the pointer.\n");
    break;

    /* Modes 6 and 7 are too complicated to expand; a pointer to the data
     * will be placed in the appropriate place by the synthetic instruction
     * right before this one.
     */
  case 6:
  case 7:
    if (!reversed)
      fprintf (syn68k_c_stream, " (cpu_state.amode_p) ");
    else
      fprintf (syn68k_c_stream, " (cpu_state.reversed_amode_p) ");
    break;
  }
}